

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

char * __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::insertSpace
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,size_t index,size_t count)

{
  ulong uVar1;
  bool bVar2;
  char *__src;
  size_t sVar3;
  
  uVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  bVar2 = setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(this,uVar1 + count);
  if (bVar2) {
    sVar3 = index;
    if (uVar1 < index) {
      sVar3 = uVar1;
    }
    __src = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p + sVar3;
    if (count != 0 && index < uVar1) {
      memmove(__src + count,__src,uVar1 - sVar3);
    }
  }
  else {
    __src = (char *)0x0;
  }
  return __src;
}

Assistant:

T*
	insertSpace(
		size_t index,
		size_t count
	) {
		size_t oldCount = this->m_count;
		bool result = setCount(this->m_count + count);
		if (!result)
			return NULL;

		if (index > oldCount)
			index = oldCount;

		T* dst = this->m_p + index;

		if (count && index < oldCount)
			Details::copy(dst + count, dst, oldCount - index);

		return dst;
	}